

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2.h
# Opt level: O0

void ncnn::pooling2x2s2_max_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long *in_RSI;
  long *in_RDI;
  float max1;
  float max0;
  int remain;
  int i;
  float *r1;
  float *r0;
  int outcount;
  float *outptr;
  float *img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  float local_298;
  float local_294;
  int local_290;
  int local_28c;
  float *local_288;
  float *local_280;
  int local_274;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined4 local_258;
  long local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  float *local_228;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  long local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined8 local_1d0;
  float *local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long *local_1a0;
  long *local_198;
  undefined1 local_18d;
  int local_18c;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_168;
  undefined8 *local_158;
  undefined8 *local_148;
  undefined1 local_13d;
  int local_13c;
  undefined8 *local_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  float *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_68;
  undefined8 *local_48;
  
  local_1ac = *(int *)((long)in_RDI + 0x2c);
  local_1b0 = (int)in_RDI[7];
  local_1b4 = *(int *)((long)in_RSI + 0x2c);
  local_1b8 = (int)in_RSI[6];
  local_1bc = local_1ac * 2 + local_1b4 * -2;
  local_1a0 = in_RSI;
  local_198 = in_RDI;
  for (local_1c0 = 0; local_1c0 < local_1b0; local_1c0 = local_1c0 + 1) {
    local_180 = &local_210;
    local_bc = *(int *)((long)local_198 + 0x2c);
    local_c0 = (int)local_198[6];
    local_c4 = *(undefined4 *)((long)local_198 + 0x34);
    local_280 = (float *)(*local_198 + local_198[8] * (long)local_1c0 * local_198[2]);
    local_d8 = local_198[2];
    local_dc = (undefined4)local_198[3];
    local_e8 = local_198[4];
    local_b8 = &local_210;
    local_a8 = (long)local_bc * (long)local_c0 * local_d8;
    local_178 = &local_210;
    local_168 = &local_210;
    local_130 = &local_270;
    local_f4 = *(int *)((long)local_1a0 + 0x2c);
    local_f8 = (int)local_1a0[6];
    local_fc = *(undefined4 *)((long)local_1a0 + 0x34);
    local_228 = (float *)(*local_1a0 + local_1a0[8] * (long)local_1c0 * local_1a0[2]);
    local_110 = local_1a0[2];
    local_114 = (undefined4)local_1a0[3];
    local_120 = local_1a0[4];
    local_f0 = &local_270;
    local_98 = (long)local_f4 * (long)local_f8 * local_110;
    local_148 = &local_270;
    local_158 = &local_270;
    local_1d8 = 0;
    local_1dc = 0;
    local_1e0 = 0;
    local_1e4 = 0;
    local_1f8 = 0;
    local_200 = 0;
    local_208 = 0;
    local_210 = 0;
    local_9c = 0x10;
    local_ac = 0x10;
    local_13c = local_1c0;
    local_13d = 1;
    local_18c = local_1c0;
    local_18d = 1;
    local_1d0 = 0;
    local_1e8 = 0;
    local_270 = 0;
    local_260 = 0;
    local_258 = 0;
    local_248 = 0;
    local_244 = 0;
    local_240 = 0;
    local_23c = 0;
    local_238 = 0;
    local_230 = 0;
    local_268 = 0;
    local_274 = 0;
    local_288 = local_280 + local_1ac;
    local_1c8 = local_280;
    local_108 = local_228;
    local_d0 = local_280;
    local_68 = local_158;
    local_48 = local_168;
    local_250 = local_120;
    local_1f0 = local_e8;
    for (local_28c = 0; local_28c < local_1b8; local_28c = local_28c + 1) {
      for (local_290 = local_1b4; 0 < local_290; local_290 = local_290 + -1) {
        pfVar1 = std::max<float>(local_280,local_280 + 1);
        local_294 = *pfVar1;
        pfVar1 = std::max<float>(local_288,local_288 + 1);
        local_298 = *pfVar1;
        pfVar1 = std::max<float>(&local_294,&local_298);
        *local_228 = *pfVar1;
        local_280 = local_280 + 2;
        local_288 = local_288 + 2;
        local_228 = local_228 + 1;
        local_274 = local_274 + 1;
      }
      local_280 = local_280 + local_1bc;
      local_288 = local_288 + local_1bc;
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_avx(const Mat& bottom_blob, Mat& top_blob,
                                 const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const float* img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);
        int outcount = 0;
        const float* r0 = img0;
        const float* r1 = img0 + w;
#if __AVX2__
        __m256i permute_mask = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
#endif // __AVX__

        for (int i = 0; i < outh; i++)
        {
#if __AVX2__
            int nn = outw >> 2;
            int remain = outw - (nn << 2);
#else
            int remain = outw;
#endif // __AVX__

#if __AVX2__
            for (; nn > 0; nn--)
            {
                __m256 _r0 = _mm256_loadu_ps(r0);
                __m256 _r1 = _mm256_loadu_ps(r1);
                __m256 _max_r0_r1 = _mm256_max_ps(_r0, _r1);
                _max_r0_r1 = _mm256_castsi256_ps(_mm256_permutevar8x32_epi32(
                                                     _mm256_castps_si256(_max_r0_r1), permute_mask));
                __m128 _max_0 = _mm256_extractf128_ps(_max_r0_r1, 0);
                __m128 _max_1 = _mm256_extractf128_ps(_max_r0_r1, 1);
                __m128 _max = _mm_max_ps(_max_0, _max_1);
                _mm_storeu_ps(outptr, _max);
                r0 += 8;
                r1 += 8;
                outptr += 4;
                outcount += 4;
            }
#endif // __AVX__
            for (; remain > 0; remain--)
            {
                float max0 = std::max(r0[0], r0[1]);
                float max1 = std::max(r1[0], r1[1]);

                *outptr = std::max(max0, max1);

                r0 += 2;
                r1 += 2;
                outptr++;
                outcount++;
            }
            r0 += tailstep;
            r1 += tailstep;
        }
    }
}